

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_playlist.cpp
# Opt level: O2

void __thiscall FPlayList::Shuffle(FPlayList *this)

{
  FString *pFVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0;
  iVar3 = 0;
  uVar4 = (ulong)(this->Songs).Count;
  while (uVar4 != 0) {
    pFVar1 = (this->Songs).Array;
    uVar2 = rand();
    swapvalues<FString>((FString *)((long)&pFVar1->Chars + lVar5),
                        (this->Songs).Array +
                        (uint)(iVar3 + (int)((ulong)uVar2 % (uVar4 & 0xffffffff))));
    iVar3 = iVar3 + 1;
    lVar5 = lVar5 + 8;
    uVar4 = uVar4 - 1;
  }
  this->Position = 0;
  return;
}

Assistant:

void FPlayList::Shuffle ()
{
	unsigned int numsongs = Songs.Size();
	unsigned int i;

	for (i = 0; i < numsongs; ++i)
	{
		swapvalues (Songs[i], Songs[(rand() % (numsongs - i)) + i]);
	}
	Position = 0;
}